

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O3

base_learner * bfgs_setup(options_i *options,vw *all)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  options_i *this;
  bfgs *__s;
  typed_option<int> *ptVar5;
  typed_option<float> *ptVar6;
  typed_option<unsigned_long> *ptVar7;
  size_t sVar8;
  learner<bfgs,_example> *plVar9;
  vw_exception *this_00;
  byte bVar10;
  uint32_t *puVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  vw_ostream *pvVar15;
  bool bfgs_option;
  bool conjugate_gradient;
  option_group_definition bfgs_inner_options;
  option_group_definition bfgs_outer_options;
  stringstream __msg;
  bool local_68a;
  bool local_689;
  undefined1 *local_688 [2];
  undefined1 local_678 [16];
  free_ptr<bfgs> local_668;
  bool *local_658;
  option_group_definition local_650;
  options_i *local_618;
  option_group_definition local_610;
  undefined1 *local_5d8;
  long local_5d0;
  undefined1 local_5c8 [16];
  undefined1 *local_5b8;
  long local_5b0;
  undefined1 local_5a8 [16];
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  undefined1 local_4f8 [48];
  string local_4c8 [64];
  bool local_488;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_470;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_460;
  string local_370;
  typed_option<float> local_350;
  typed_option<int> local_2b0;
  typed_option<bool> local_210;
  typed_option<bool> local_170;
  typed_option<bool> local_d0;
  
  __s = calloc_or_throw<bfgs>(1);
  memset(__s,0,0x118);
  local_668._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)destroy_free<bfgs>;
  local_689 = false;
  local_68a = false;
  local_668._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bfgs_*,_false>._M_head_impl
       = __s;
  local_5b8 = local_5a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5b8,"LBFGS and Conjugate Gradient options","");
  local_610.m_name._M_dataplus._M_p = (pointer)&local_610.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_610,local_5b8,local_5b8 + local_5b0);
  local_610.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_610.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_610.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_5b8 != local_5a8) {
    operator_delete(local_5b8);
  }
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"conjugate_gradient","");
  local_618 = options;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_4f8,&local_518,&local_689);
  local_488 = true;
  paVar1 = &local_650.m_name.field_2;
  local_650.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_650,"use conjugate gradient based optimization","");
  std::__cxx11::string::_M_assign(local_4c8);
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_4f8);
  VW::config::option_group_definition::add<bool>(&local_610,&local_d0);
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d0130;
  if (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_650.m_name._M_dataplus._M_p);
  }
  local_4f8._0_8_ = &PTR__typed_option_002d0130;
  if (local_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460._M_pi);
  }
  if (local_470._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_4f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p);
  }
  local_5d8 = local_5c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5d8,"LBFGS and Conjugate Gradient options","");
  local_650.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_650,local_5d8,local_5d8 + local_5d0);
  local_650.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_650.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_650.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_5d8 != local_5c8) {
    operator_delete(local_5d8);
  }
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"bfgs","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_4f8,&local_538,&local_68a);
  local_488 = true;
  local_688[0] = local_678;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_688,"use conjugate gradient based optimization","");
  std::__cxx11::string::_M_assign(local_4c8);
  VW::config::typed_option<bool>::typed_option(&local_170,(typed_option<bool> *)local_4f8);
  VW::config::option_group_definition::add<bool>(&local_650,&local_170);
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d0130;
  if (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_688[0] != local_678) {
    operator_delete(local_688[0]);
  }
  local_4f8._0_8_ = &PTR__typed_option_002d0130;
  if (local_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460._M_pi);
  }
  if (local_470._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_4f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p);
  }
  local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"hessian_on","");
  local_658 = &all->hessian_on;
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_4f8,&local_558,local_658)
  ;
  local_688[0] = local_678;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_688,"use second derivative in line search","");
  std::__cxx11::string::_M_assign(local_4c8);
  VW::config::typed_option<bool>::typed_option(&local_210,(typed_option<bool> *)local_4f8);
  VW::config::option_group_definition::add<bool>(&local_650,&local_210);
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d0130;
  if (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_688[0] != local_678) {
    operator_delete(local_688[0]);
  }
  local_4f8._0_8_ = &PTR__typed_option_002d0130;
  if (local_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460._M_pi);
  }
  if (local_470._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_4f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p);
  }
  local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"mem","");
  VW::config::typed_option<int>::typed_option((typed_option<int> *)local_4f8,&local_578,&__s->m);
  ptVar5 = VW::config::typed_option<int>::default_value((typed_option<int> *)local_4f8,0xf);
  local_688[0] = local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"memory in bfgs","");
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::typed_option<int>::typed_option(&local_2b0,ptVar5);
  VW::config::option_group_definition::add<int>(&local_650,&local_2b0);
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d0aa8;
  if (local_2b0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_688[0] != local_678) {
    operator_delete(local_688[0]);
  }
  local_4f8._0_8_ = &PTR__typed_option_002d0aa8;
  if (local_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460._M_pi);
  }
  if (local_470._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_4f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p);
  }
  local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"termination","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_4f8,&local_598,&__s->rel_threshold);
  ptVar6 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_4f8,0.001);
  local_688[0] = local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"Termination threshold","");
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_350,ptVar6);
  VW::config::option_group_definition::add<float>(&local_650,&local_350);
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d0278;
  if (local_350.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if (local_688[0] != local_678) {
    operator_delete(local_688[0]);
  }
  this = local_618;
  local_4f8._0_8_ = &PTR__typed_option_002d0278;
  if (local_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460._M_pi);
  }
  if (local_470._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_4f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p);
  }
  (**this->_vptr_options_i)(this,&local_610);
  if ((local_689 == false) && ((**this->_vptr_options_i)(this,&local_650), local_68a == false)) {
    plVar9 = (learner<bfgs,_example> *)0x0;
  }
  else {
    __s->all = all;
    __s->wolfe1_bound = 0.01;
    __s->first_hessian_on = true;
    __s->backstep_on = false;
    __s->first_pass = true;
    __s->gradient_pass = true;
    __s->preconditioner_pass = true;
    __s->final_pass = all->numpasses;
    __s->no_win_counter = 0;
    if (all->holdout_set_off == false) {
      all->sd->holdout_best_loss = 3.4028234663852886e+38;
      local_4f8._0_8_ = local_4f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"early_terminate","");
      ptVar7 = VW::config::options_i::get_typed_option<unsigned_long>(this,(string *)local_4f8);
      psVar2 = (ptVar7->m_value).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (psVar2 == (size_t *)0x0) {
        sVar8 = 0;
      }
      else {
        sVar8 = *psVar2;
      }
      __s->early_stop_thres = sVar8;
      if ((undefined1 *)local_4f8._0_8_ != local_4f8 + 0x10) {
        operator_delete((void *)local_4f8._0_8_);
      }
    }
    if (__s->m == 0) {
      *local_658 = true;
    }
    if (all->quiet == false) {
      pcVar13 = "enabling conjugate gradient optimization via BFGS ";
      if (0 < __s->m) {
        pcVar13 = "enabling BFGS based optimization ";
      }
      lVar14 = 0x21;
      lVar12 = 0x32;
      if (0 < __s->m) {
        lVar12 = 0x21;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (&(__s->all->trace_message).super_ostream,pcVar13,lVar12);
      pvVar15 = &__s->all->trace_message;
      pcVar13 = "**without** curvature calculation";
      if (*local_658 != false) {
        pcVar13 = "with curvature calculation";
        lVar14 = 0x1a;
      }
      std::__ostream_insert<char,std::char_traits<char>>(&pvVar15->super_ostream,pcVar13,lVar14);
      std::ios::widen((char)(pvVar15->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar15);
      std::ostream::put((char)pvVar15);
      std::ostream::flush();
    }
    if ((all->numpasses < 2) && (all->training == true)) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_4f8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_4f8 + 0x10),"you must make at least 2 passes to use BFGS",0x2b);
      this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this_00,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/bfgs.cc"
                 ,0x479,&local_370);
      __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    all->bfgs = true;
    if ((all->weights).sparse == true) {
      sparse_parameters::stride_shift(&(all->weights).sparse_weights,2);
      puVar11 = &(all->weights).dense_weights._stride_shift;
      if (((all->weights).sparse & 1U) != 0) {
        puVar11 = &(all->weights).sparse_weights._stride_shift;
      }
      bVar10 = (byte)*puVar11;
    }
    else {
      (all->weights).dense_weights._stride_shift = 2;
      bVar10 = 2;
    }
    plVar9 = LEARNER::init_learner<bfgs,example,LEARNER::learner<char,char>>
                       (&local_668,learn,predict,(ulong)(uint)(1 << (bVar10 & 0x1f)));
    *(code **)(plVar9 + 0x80) = save_load;
    uVar3 = *(undefined8 *)(plVar9 + 0x18);
    uVar4 = *(undefined8 *)(plVar9 + 0x20);
    *(undefined8 *)(plVar9 + 0x70) = uVar3;
    *(undefined8 *)(plVar9 + 0x78) = uVar4;
    *(undefined8 *)plVar9 = uVar3;
    *(undefined8 *)(plVar9 + 8) = uVar4;
    *(code **)(plVar9 + 0x10) = init_driver;
    *(undefined8 *)(plVar9 + 0x88) = uVar3;
    *(undefined8 *)(plVar9 + 0x90) = uVar4;
    *(code **)(plVar9 + 0x98) = end_pass;
    *(undefined8 *)(plVar9 + 0xb8) = uVar3;
    *(undefined8 *)(plVar9 + 0xc0) = uVar4;
    *(code **)(plVar9 + 200) = finish;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_650.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650.m_name._M_dataplus._M_p != &local_650.m_name.field_2) {
    operator_delete(local_650.m_name._M_dataplus._M_p);
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_610.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
    operator_delete(local_610.m_name._M_dataplus._M_p);
  }
  if (local_668._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bfgs_*,_false>.
      _M_head_impl != (bfgs *)0x0) {
    (*(code *)local_668._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.
              super__Tuple_impl<1UL,_void_(*)(void_*)>.
              super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl)
              (local_668._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bfgs_*,_false>
               ._M_head_impl);
  }
  return (base_learner *)plVar9;
}

Assistant:

base_learner* bfgs_setup(options_i& options, vw& all)
{
  auto b = scoped_calloc_or_throw<bfgs>();
  bool conjugate_gradient = false;
  bool bfgs_option = false;
  option_group_definition bfgs_outer_options("LBFGS and Conjugate Gradient options");
  bfgs_outer_options.add(
      make_option("conjugate_gradient", conjugate_gradient).keep().help("use conjugate gradient based optimization"));

  option_group_definition bfgs_inner_options("LBFGS and Conjugate Gradient options");
  bfgs_inner_options.add(make_option("bfgs", bfgs_option).keep().help("use conjugate gradient based optimization"));
  bfgs_inner_options.add(make_option("hessian_on", all.hessian_on).help("use second derivative in line search"));
  bfgs_inner_options.add(make_option("mem", b->m).default_value(15).help("memory in bfgs"));
  bfgs_inner_options.add(
      make_option("termination", b->rel_threshold).default_value(0.001f).help("Termination threshold"));

  options.add_and_parse(bfgs_outer_options);
  if (!conjugate_gradient)
  {
    options.add_and_parse(bfgs_inner_options);
    if (!bfgs_option)
    {
      return nullptr;
    }
  }

  b->all = &all;
  b->wolfe1_bound = 0.01;
  b->first_hessian_on = true;
  b->first_pass = true;
  b->gradient_pass = true;
  b->preconditioner_pass = true;
  b->backstep_on = false;
  b->final_pass = all.numpasses;
  b->no_win_counter = 0;

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    b->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  if (b->m == 0)
    all.hessian_on = true;

  if (!all.quiet)
  {
    if (b->m > 0)
      b->all->trace_message << "enabling BFGS based optimization ";
    else
      b->all->trace_message << "enabling conjugate gradient optimization via BFGS ";
    if (all.hessian_on)
      b->all->trace_message << "with curvature calculation" << endl;
    else
      b->all->trace_message << "**without** curvature calculation" << endl;
  }

  if (all.numpasses < 2 && all.training)
    THROW("you must make at least 2 passes to use BFGS");

  all.bfgs = true;
  all.weights.stride_shift(2);

  learner<bfgs, example>& l = init_learner(b, learn, predict, all.weights.stride());
  l.set_save_load(save_load);
  l.set_init_driver(init_driver);
  l.set_end_pass(end_pass);
  l.set_finish(finish);

  return make_base(l);
}